

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

Vec_Vec_t * Saig_ManBmcSections(Aig_Man_t *p)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *Entry;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar2;
  int iVar3;
  
  Aig_ManIncrementTravId(p);
  p->pConst1->TravId = p->nTravIds;
  p_00 = Vec_PtrAlloc(1000);
  for (iVar3 = 0; iVar3 < p->nTruePos; iVar3 = iVar3 + 1) {
    Entry = Vec_PtrEntry(p->vCos,iVar3);
    *(int *)((long)Entry + 0x20) = p->nTravIds;
    Vec_PtrPush(p_00,Entry);
  }
  p_01 = Vec_PtrAlloc(0x14);
  while (0 < p_00->nSize) {
    p_02 = Saig_ManBmcDfsNodes(p,p_00);
    Vec_PtrPush(p_01,p_02);
    p_00->nSize = 0;
    for (iVar3 = 0; iVar3 < p_02->nSize; iVar3 = iVar3 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar3);
      iVar1 = Saig_ObjIsLo(p,pAVar2);
      if (iVar1 != 0) {
        pAVar2 = Saig_ObjLoToLi(p,pAVar2);
        if (pAVar2->TravId != p->nTravIds) {
          pAVar2->TravId = p->nTravIds;
          Vec_PtrPush(p_00,pAVar2);
        }
      }
    }
  }
  Vec_PtrFree(p_00);
  return (Vec_Vec_t *)p_01;
}

Assistant:

Vec_Vec_t * Saig_ManBmcSections( Aig_Man_t * p )
{
    Vec_Ptr_t * vSects, * vRoots, * vCone;
    Aig_Obj_t * pObj, * pObjPo;
    int i;
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    // start the roots
    vRoots = Vec_PtrAlloc( 1000 );
    Saig_ManForEachPo( p, pObjPo, i )
    {
        Aig_ObjSetTravIdCurrent( p, pObjPo );
        Vec_PtrPush( vRoots, pObjPo );
    }
    // compute the cones
    vSects = Vec_PtrAlloc( 20 );
    while ( Vec_PtrSize(vRoots) > 0 )
    {
        vCone = Saig_ManBmcDfsNodes( p, vRoots );
        Vec_PtrPush( vSects, vCone );
        // get the next set of roots
        Vec_PtrClear( vRoots );
        Vec_PtrForEachEntry( Aig_Obj_t *, vCone, pObj, i )
        {
            if ( !Saig_ObjIsLo(p, pObj) )
                continue;
            pObjPo = Saig_ObjLoToLi( p, pObj );
            if ( Aig_ObjIsTravIdCurrent(p, pObjPo) )
                continue;
            Aig_ObjSetTravIdCurrent( p, pObjPo );
            Vec_PtrPush( vRoots, pObjPo );
        }
    }
    Vec_PtrFree( vRoots );
    return (Vec_Vec_t *)vSects;
}